

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualActionIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TransitionObservationIndependentMADPDiscrete *this,Index ja_e,Scope *agSC)

{
  pointer puVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38,
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_39);
  plVar3 = (long *)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xf0))();
  puVar1 = (agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar4 = (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 != 0) {
    lVar2 = *plVar3;
    uVar5 = 0;
    do {
      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (ulong)*(uint *)(lVar2 + (ulong)puVar1[uVar5] * 8);
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 2));
  }
  IndexTools::JointToIndividualIndices(__return_storage_ptr__,ja_e,&local_38);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> JointToIndividualActionIndices(
        Index ja_e, const Scope& agSC) const
        { 
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            std::vector<Index> ja_e_vec = IndexTools::JointToIndividualIndices(ja_e, nr_A_e);
            return(ja_e_vec);
        }